

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

symbol * Symbol_new(char *x)

{
  byte *pbVar1;
  ushort *puVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  symbol *psVar6;
  symbol *psVar7;
  char *pcVar8;
  ushort **ppuVar9;
  FILE *__stream;
  ulong uVar10;
  byte *filebuf;
  size_t sVar11;
  long lVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  rule *prVar16;
  symbol **ppsVar17;
  undefined8 *puVar18;
  long *plVar19;
  void *pvVar20;
  char *pcVar21;
  symbol *extraout_RAX;
  symbol *extraout_RAX_00;
  undefined4 extraout_var;
  int iVar22;
  ulong uVar23;
  undefined8 *puVar24;
  byte bVar25;
  byte bVar26;
  int iVar27;
  byte *__s2;
  byte *pbVar28;
  byte *pbVar29;
  byte bVar30;
  long lVar31;
  uint uVar32;
  uint uVar33;
  size_t sVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  int iStack_3fcc;
  char acStack_3f90 [56];
  char *pcStack_3f58;
  uint uStack_3f50;
  uint uStack_3f4c;
  byte *pbStack_3f48;
  long lStack_3f40;
  undefined4 uStack_3f38;
  symbol *psStack_3f30;
  symbol *psStack_3f28;
  symbol *psStack_3f20;
  byte *pbStack_3f18;
  uint uStack_3f10;
  long alStack_3f08 [999];
  undefined8 auStack_1fd0 [1001];
  rule *prStack_88;
  byte *pbStack_80;
  char **ppcStack_78;
  int iStack_70;
  int *piStack_68;
  e_assoc eStack_60;
  int iStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  symbol *psStack_48;
  
  psVar6 = Symbol_find(x);
  psVar7 = psVar6;
  if (psVar6 == (symbol *)0x0) {
    lVar31 = 1;
    psVar7 = (symbol *)calloc(1,0x60);
    if (psVar7 == (symbol *)0x0) {
      Symbol_new_cold_1();
      psStack_48 = psVar6;
      memset(&pcStack_3f58,0,0x3f10);
      pcStack_3f58 = *(char **)(lVar31 + 0xc0);
      uStack_3f4c = 0;
      uStack_3f38 = 0;
      lStack_3f40 = lVar31;
      __stream = fopen(pcStack_3f58,"rb");
      if (__stream == (FILE *)0x0) {
        Parse_cold_10();
        return extraout_RAX;
      }
      fseek(__stream,0,2);
      uVar10 = ftell(__stream);
      rewind(__stream);
      filebuf = (byte *)malloc((long)((uVar10 << 0x20) + 0x100000000) >> 0x20);
      if ((100000000 < (int)uVar10) || (filebuf == (byte *)0x0)) {
        Parse_cold_9();
        return extraout_RAX_00;
      }
      sVar34 = (long)(uVar10 << 0x20) >> 0x20;
      sVar11 = fread(filebuf,1,sVar34,__stream);
      if (sVar11 != sVar34) {
        ErrorMsg(pcStack_3f58,0,"Can\'t read in all %d bytes of this file.",uVar10 & 0xffffffff);
        free(filebuf);
        *(int *)(lVar31 + 0x38) = *(int *)(lVar31 + 0x38) + 1;
        iVar4 = fclose(__stream);
        return (symbol *)CONCAT44(extraout_var,iVar4);
      }
      fclose(__stream);
      iVar4 = strip_crlf((char *)filebuf,(int)uVar10);
      filebuf[iVar4] = 0;
      ppcVar3 = azDefine;
      iVar4 = nDefine;
      lVar12 = (long)nDefine;
      uVar10 = (ulong)(uint)nDefine;
      pbVar28 = filebuf + 6;
      uVar33 = 0;
      iStack_3fcc = 0;
      uVar35 = 6;
      pbVar29 = filebuf;
      for (lVar36 = 0; (bVar25 = filebuf[lVar36], bVar25 == 10 || (bVar25 != 0));
          lVar36 = lVar36 + 1) {
        if ((bVar25 == 0x25) && ((pbVar15 = filebuf + lVar36, lVar36 == 0 || (pbVar15[-1] == 10))))
        {
          iVar5 = strncmp((char *)pbVar15,"%endif",6);
          if ((iVar5 == 0) &&
             (ppuVar9 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar9 + (ulong)pbVar15[6] * 2 + 1) & 0x20) != 0)) {
            pbVar15 = pbVar29;
            if (uVar33 == 0) {
LAB_001066af:
              uVar33 = 0;
            }
            else {
              uVar33 = uVar33 - 1;
              if (uVar33 == 0) {
                lVar13 = (long)iStack_3fcc;
                if (lVar13 < lVar36) {
                  do {
                    if (filebuf[lVar13] != 10) {
                      filebuf[lVar13] = 0x20;
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar36 != lVar13);
                }
                goto LAB_001066af;
              }
            }
            for (; (*pbVar15 != 0 && (*pbVar15 != 10)); pbVar15 = pbVar15 + 1) {
              *pbVar15 = 0x20;
            }
          }
          else {
            iVar5 = strncmp((char *)pbVar15,"%ifdef",6);
            if (((iVar5 == 0) &&
                (ppuVar9 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar9 + (ulong)pbVar15[6] * 2 + 1) & 0x20) != 0)) ||
               ((iVar5 = strncmp((char *)pbVar15,"%ifndef",7), iVar5 == 0 &&
                (ppuVar9 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar9 + (ulong)pbVar15[7] * 2 + 1) & 0x20) != 0)))) {
              pbVar14 = pbVar29;
              if (uVar33 == 0) {
                ppuVar9 = __ctype_b_loc();
                uVar23 = uVar35;
                __s2 = pbVar28;
                do {
                  pbVar1 = __s2 + 1;
                  __s2 = __s2 + 1;
                  uVar23 = uVar23 + 1;
                } while ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
                bVar25 = filebuf[uVar23 & 0xffffffff];
                if (bVar25 == 0) {
                  uVar37 = 0;
                }
                else {
                  uVar37 = 0;
                  do {
                    if ((*(byte *)((long)*ppuVar9 + (ulong)bVar25 * 2 + 1) & 0x20) != 0) break;
                    bVar25 = filebuf[uVar37 + (uVar23 & 0xffffffff) + 1];
                    uVar37 = uVar37 + 1;
                  } while (bVar25 != 0);
                }
                bVar38 = true;
                bVar39 = 0 < lVar12;
                if (0 < iVar4) {
                  bVar39 = true;
                  uVar23 = 1;
                  do {
                    pcVar8 = ppcVar3[uVar23 - 1];
                    iVar5 = strncmp(pcVar8,(char *)__s2,uVar37 & 0xffffffff);
                    if ((iVar5 == 0) && (sVar11 = strlen(pcVar8), (int)uVar37 == (int)sVar11)) {
                      bVar38 = false;
                      goto LAB_001067ac;
                    }
                    bVar39 = (long)uVar23 < lVar12;
                    bVar38 = uVar23 != uVar10;
                    uVar23 = uVar23 + 1;
                  } while (bVar38);
                  bVar38 = true;
                }
LAB_001067ac:
                if (pbVar15[3] != 0x6e) {
                  bVar39 = bVar38;
                }
                if (bVar39) {
                  iStack_3fcc = (int)lVar36;
                }
                uVar33 = (uint)bVar39;
              }
              else {
                uVar33 = uVar33 + 1;
              }
              for (; (*pbVar14 != 0 && (*pbVar14 != 10)); pbVar14 = pbVar14 + 1) {
                *pbVar14 = 0x20;
              }
            }
          }
        }
        pbVar29 = pbVar29 + 1;
        pbVar28 = pbVar28 + 1;
        uVar35 = uVar35 + 1;
      }
      if (uVar33 != 0) {
        Parse_cold_1();
        if (x2a == (s_x2 *)0x0) {
          return (symbol *)0x0;
        }
        return (symbol *)(ulong)(uint)x2a->count;
      }
      uVar33 = 1;
      pbVar28 = filebuf;
LAB_00106821:
      while( true ) {
        while( true ) {
          bVar25 = *pbVar28;
          uVar10 = (ulong)bVar25;
          if (uVar10 == 10) {
            uVar33 = uVar33 + 1;
          }
          else if (bVar25 == 0) {
            free(filebuf);
            *(ulong *)(lVar31 + 8) = CONCAT44(uStack_54,uStack_58);
            *(uint *)(lVar31 + 0x38) = uStack_3f4c;
            return (symbol *)(ulong)uStack_3f4c;
          }
          ppuVar9 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar9 + uVar10 * 2 + 1) & 0x20) == 0) break;
          pbVar28 = pbVar28 + 1;
        }
        if (bVar25 != 0x2f) break;
        if (pbVar28[1] == 0x2a) {
          bVar25 = pbVar28[2];
          bVar39 = bVar25 != 0;
          if (bVar25 == 0) {
            pbVar28 = pbVar28 + 2;
          }
          else {
            pbVar28 = pbVar28 + 3;
            do {
              if (bVar25 == 10) {
                uVar33 = uVar33 + 1;
              }
              else if ((bVar25 == 0x2f) && (pbVar28[-2] == 0x2a)) break;
              bVar25 = *pbVar28;
              pbVar28 = pbVar28 + 1;
              bVar39 = bVar25 != 0;
            } while (bVar39);
            pbVar28 = pbVar28 + -1;
          }
          pbVar28 = pbVar28 + bVar39;
        }
        else {
          if (pbVar28[1] != 0x2f) break;
          for (pbVar28 = pbVar28 + 2; (*pbVar28 != 0 && (*pbVar28 != 10)); pbVar28 = pbVar28 + 1) {
          }
        }
      }
      uVar32 = uVar33;
      uStack_3f50 = uVar33;
      pbStack_3f48 = pbVar28;
      if (bVar25 == 0x7b) {
        pbVar29 = pbVar28 + 1;
        bVar25 = pbVar28[1];
        if (bVar25 != 0) {
          iVar4 = 1;
          do {
            if ((iVar4 < 2) && (bVar25 == 0x7d)) {
              pbVar28 = pbVar28 + 2;
              goto LAB_00106ade;
            }
            if (bVar25 < 0x2f) {
              if (bVar25 == 10) {
LAB_001069bf:
                uVar32 = uVar32 + 1;
              }
              else if ((bVar25 == 0x22) || (bVar25 == 0x27)) {
                bVar26 = pbVar29[1];
                pbVar29 = pbVar29 + 1;
                if (bVar26 != 0) {
                  bVar30 = 0;
                  do {
                    if ((bVar30 != 0x5c) && (bVar26 == bVar25)) break;
                    uVar32 = uVar32 + (bVar26 == 10);
                    bVar39 = bVar30 == 0x5c;
                    bVar30 = bVar26;
                    if (bVar39) {
                      bVar30 = 0;
                    }
                    bVar26 = pbVar29[1];
                    pbVar29 = pbVar29 + 1;
                  } while (bVar26 != 0);
                }
              }
            }
            else if (bVar25 == 0x2f) {
              if (pbVar28[2] == 0x2f) {
                for (pbVar29 = pbVar28 + 3; *pbVar29 != 0; pbVar29 = pbVar29 + 1) {
                  if (*pbVar29 == 10) goto LAB_001069bf;
                }
              }
              else if (pbVar28[2] == 0x2a) {
                pbVar29 = pbVar28 + 3;
                if (pbVar28[3] != 0) {
                  bVar25 = 0;
                  bVar26 = pbVar28[3];
                  do {
                    if (bVar25 == 0x2a && bVar26 == 0x2f) break;
                    uVar32 = uVar32 + (bVar26 == 10);
                    pbVar28 = pbVar29 + 1;
                    pbVar29 = pbVar29 + 1;
                    bVar25 = bVar26;
                    bVar26 = *pbVar28;
                  } while (*pbVar28 != 0);
                }
              }
            }
            else if (bVar25 == 0x7b) {
              iVar4 = iVar4 + 1;
            }
            else if (bVar25 == 0x7d) {
              iVar4 = iVar4 + -1;
            }
            pbVar28 = pbVar29;
            pbVar29 = pbVar28 + 1;
            bVar25 = pbVar28[1];
          } while (bVar25 != 0);
        }
        ErrorMsg(pcStack_3f58,uVar33,
                 "C code starting on this line is not terminated before the end of the file.");
        uStack_3f4c = uStack_3f4c + 1;
        pbVar28 = pbVar29;
      }
      else {
        pbVar29 = pbVar28;
        if (bVar25 == 0x22) {
          do {
            pbVar28 = pbVar29 + 1;
            while( true ) {
              pbVar29 = pbVar28;
              bVar25 = *pbVar29;
              if (bVar25 == 10) break;
              pbVar28 = pbVar29 + 1;
              if (bVar25 == 0x22) goto LAB_00106ade;
              if (bVar25 == 0) {
                Parse_cold_2();
                pbVar28 = pbVar29;
                goto LAB_00106ade;
              }
            }
            uVar32 = uVar32 + 1;
          } while( true );
        }
        puVar2 = *ppuVar9;
        if ((puVar2[uVar10] & 8) == 0) {
          if ((uVar10 == 0x2f) || (bVar25 == 0x7c)) {
LAB_00106acd:
            if ((*(byte *)((long)puVar2 + (ulong)pbVar28[1] * 2 + 1) & 4) != 0) {
              bVar25 = pbVar28[2];
              pbVar29 = pbVar28 + 2;
              while ((pbVar28 = pbVar29, bVar25 != 0 &&
                     ((bVar25 == 0x5f || ((puVar2[bVar25] & 8) != 0))))) {
                bVar25 = pbVar29[1];
                pbVar29 = pbVar29 + 1;
              }
              goto LAB_00106ade;
            }
          }
          else if (bVar25 == 0x3a) {
            if ((pbVar28[1] == 0x3a) && (pbVar28[2] == 0x3d)) {
              pbVar29 = pbVar28 + 3;
              pbVar28 = pbVar29;
              goto LAB_00106ade;
            }
            if (uVar10 == 0x7c) goto LAB_00106acd;
          }
          pbVar29 = pbVar28 + 1;
          pbVar28 = pbVar29;
        }
        else {
          bVar25 = *pbVar28;
          while ((pbVar28 = pbVar29, bVar25 != 0 &&
                 ((bVar25 == 0x5f || ((puVar2[bVar25] & 8) != 0))))) {
            bVar25 = pbVar29[1];
            pbVar29 = pbVar29 + 1;
          }
        }
      }
LAB_00106ade:
      uVar33 = uVar32;
      bVar25 = *pbVar29;
      *pbVar29 = 0;
      pbVar15 = (byte *)Strsafe((char *)pbStack_3f48);
      uVar32 = uStack_3f10;
      psVar7 = psStack_3f28;
      psVar6 = psStack_3f30;
      switch(uStack_3f38) {
      case 0:
        prStack_88 = (rule *)0x0;
        uStack_4c = 0;
        iStack_5c = 0;
        uStack_58 = 0;
        uStack_54 = 0;
        uStack_50 = 0;
        *(undefined4 *)(lStack_3f40 + 0x20) = 0;
      case 1:
        uVar10 = (ulong)*pbVar15;
        if (uVar10 == 0x25) {
LAB_00106fee:
          uStack_3f38 = 2;
        }
        else if ((*(byte *)((long)*ppuVar9 + uVar10 * 2 + 1) & 2) == 0) {
          if (uVar10 == 0x5b) {
            uStack_3f38 = 0xc;
          }
          else if (*pbVar15 == 0x7b) {
            if (prStack_88 == (rule *)0x0) {
              Parse_cold_8();
              psVar6 = psStack_3f30;
            }
            else if (prStack_88->code == (char *)0x0) {
              prStack_88->line = uStack_3f50;
              prStack_88->code = (char *)(pbVar15 + 1);
              prStack_88->noCode = 0;
            }
            else {
              Parse_cold_7();
              psVar6 = psStack_3f30;
            }
          }
          else {
            pcVar8 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107bb0:
            ErrorMsg(pcStack_3f58,uStack_3f50,pcVar8,pbVar15);
            uStack_3f4c = uStack_3f4c + 1;
            psVar6 = psStack_3f30;
          }
        }
        else {
          psStack_3f20 = Symbol_new((char *)pbVar15);
          uStack_3f10 = 0;
          pbStack_3f18 = (byte *)0x0;
          uStack_3f38 = 5;
          psVar6 = psStack_3f30;
        }
        break;
      case 2:
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 4) == 0) {
          pcVar8 = "Illegal declaration keyword: \"%s\".";
          goto LAB_00107b28;
        }
        ppcStack_78 = (char **)0x0;
        piStack_68 = (int *)0x0;
        iStack_70 = 1;
        uStack_3f38 = 3;
        pbStack_80 = pbVar15;
        iVar4 = strcmp((char *)pbVar15,"name");
        if (iVar4 == 0) {
          ppcStack_78 = (char **)(lStack_3f40 + 0x50);
          goto LAB_001075e2;
        }
        iVar4 = strcmp((char *)pbVar15,"include");
        if (iVar4 == 0) {
          ppcStack_78 = (char **)(lStack_3f40 + 0x80);
          psVar6 = psStack_3f30;
        }
        else {
          iVar4 = strcmp((char *)pbVar15,"code");
          if (iVar4 == 0) {
            lVar12 = 0xa8;
          }
          else {
            iVar4 = strcmp((char *)pbVar15,"token_destructor");
            if (iVar4 == 0) {
              lVar12 = 0xb0;
            }
            else {
              iVar4 = strcmp((char *)pbVar15,"default_destructor");
              if (iVar4 == 0) {
                lVar12 = 0xb8;
              }
              else {
                iVar4 = strcmp((char *)pbVar15,"token_prefix");
                if (iVar4 == 0) {
                  ppcStack_78 = (char **)(lStack_3f40 + 0xd8);
LAB_001075e2:
                  iStack_70 = 0;
                  psVar6 = psStack_3f30;
                  break;
                }
                iVar4 = strcmp((char *)pbVar15,"syntax_error");
                if (iVar4 == 0) {
                  lVar12 = 0x88;
                }
                else {
                  iVar4 = strcmp((char *)pbVar15,"parse_accept");
                  if (iVar4 == 0) {
                    lVar12 = 0xa0;
                  }
                  else {
                    iVar4 = strcmp((char *)pbVar15,"parse_failure");
                    if (iVar4 == 0) {
                      lVar12 = 0x98;
                    }
                    else {
                      iVar4 = strcmp((char *)pbVar15,"stack_overflow");
                      if (iVar4 != 0) {
                        iVar4 = strcmp((char *)pbVar15,"extra_argument");
                        if (iVar4 == 0) {
                          ppcStack_78 = (char **)(lStack_3f40 + 0x58);
                        }
                        else {
                          iVar4 = strcmp((char *)pbVar15,"token_type");
                          if (iVar4 == 0) {
                            ppcStack_78 = (char **)(lStack_3f40 + 0x60);
                          }
                          else {
                            iVar4 = strcmp((char *)pbVar15,"default_type");
                            if (iVar4 == 0) {
                              ppcStack_78 = (char **)(lStack_3f40 + 0x68);
                            }
                            else {
                              iVar4 = strcmp((char *)pbVar15,"stack_size");
                              if (iVar4 == 0) {
                                ppcStack_78 = (char **)(lStack_3f40 + 0x78);
                              }
                              else {
                                iVar4 = strcmp((char *)pbVar15,"start_symbol");
                                if (iVar4 != 0) {
                                  iVar4 = strcmp((char *)pbVar15,"left");
                                  if (iVar4 == 0) {
                                    iStack_5c = iStack_5c + 1;
                                    eStack_60 = LEFT;
                                  }
                                  else {
                                    iVar4 = strcmp((char *)pbVar15,"right");
                                    if (iVar4 == 0) {
                                      iStack_5c = iStack_5c + 1;
                                      eStack_60 = RIGHT;
                                    }
                                    else {
                                      iVar4 = strcmp((char *)pbVar15,"nonassoc");
                                      if (iVar4 != 0) {
                                        iVar4 = strcmp((char *)pbVar15,"destructor");
                                        if (iVar4 == 0) {
                                          uStack_3f38 = 0x10;
                                          psVar6 = psStack_3f30;
                                        }
                                        else {
                                          iVar4 = strcmp((char *)pbVar15,"type");
                                          if (iVar4 == 0) {
                                            uStack_3f38 = 0x11;
                                            psVar6 = psStack_3f30;
                                          }
                                          else {
                                            iVar4 = strcmp((char *)pbVar15,"fallback");
                                            if (iVar4 == 0) {
                                              psStack_3f30 = (symbol *)0x0;
                                              uStack_3f38 = 0x12;
                                              psVar6 = psStack_3f30;
                                            }
                                            else {
                                              iVar4 = strcmp((char *)pbVar15,"wildcard");
                                              if (iVar4 == 0) {
                                                uStack_3f38 = 0x13;
                                                psVar6 = psStack_3f30;
                                              }
                                              else {
                                                iVar4 = strcmp((char *)pbVar15,"token_class");
                                                if (iVar4 != 0) {
                                                  pcVar8 = "Unknown declaration keyword: \"%%%s\".";
                                                  goto LAB_00107b28;
                                                }
                                                uStack_3f38 = 0x14;
                                                psVar6 = psStack_3f30;
                                              }
                                            }
                                          }
                                        }
                                        break;
                                      }
                                      iStack_5c = iStack_5c + 1;
                                      eStack_60 = NONE;
                                    }
                                  }
                                  uStack_3f38 = 4;
                                  psVar6 = psStack_3f30;
                                  break;
                                }
                                ppcStack_78 = (char **)(lStack_3f40 + 0x70);
                              }
                            }
                          }
                        }
                        goto LAB_001075e2;
                      }
                      lVar12 = 0x90;
                    }
                  }
                }
              }
            }
          }
          ppcStack_78 = (char **)(lStack_3f40 + lVar12);
          psVar6 = psStack_3f30;
        }
        break;
      case 3:
        bVar26 = *pbVar15;
        if (((bVar26 != 0x22) && (bVar26 != 0x7b)) && (((*ppuVar9)[bVar26] & 8) == 0)) {
          ErrorMsg(pcStack_3f58,uStack_3f50,"Illegal argument to %%%s: %s",pbStack_80,pbVar15);
          goto LAB_00107b2f;
        }
        if (((ulong)bVar26 == 0x7b) || (bVar26 == 0x22)) {
          pbVar15 = pbVar15 + 1;
        }
        sVar11 = strlen((char *)pbVar15);
        pcVar8 = *ppcStack_78;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "";
        }
        sVar34 = strlen(pcVar8);
        bVar39 = false;
        if ((*(int *)(lStack_3f40 + 0xf4) == 0) && (iStack_70 != 0)) {
          if (piStack_68 == (int *)0x0) {
            bVar39 = true;
          }
          else {
            bVar39 = *piStack_68 != 0;
          }
        }
        iVar4 = (int)sVar34;
        iVar5 = (int)sVar11;
        iVar22 = iVar4 + iVar5 + 0x14;
        if (bVar39) {
          iVar27 = 0;
          pcVar8 = pcStack_3f58;
          do {
            if (*pcVar8 == '\\') {
              iVar27 = iVar27 + 1;
            }
            else if (*pcVar8 == '\0') goto LAB_001076da;
            pcVar8 = pcVar8 + 1;
          } while( true );
        }
        sVar11 = 0;
        goto LAB_00107720;
      case 4:
        if ((ulong)*pbVar15 == 0x2e) goto LAB_001073d7;
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 1) == 0) {
          pcVar8 = "Can\'t assign a precedence to \"%s\".";
        }
        else {
          psVar7 = Symbol_new((char *)pbVar15);
          if (psVar7->prec < 0) {
            psVar7->prec = iStack_5c;
            psVar7->assoc = eStack_60;
            psVar6 = psStack_3f30;
            break;
          }
          pcVar8 = "Symbol \"%s\" has already be given a precedence.";
        }
        goto LAB_00107bb0;
      case 5:
        if (*pbVar15 == 0x28) {
          uStack_3f38 = 7;
        }
        else {
          if (((*pbVar15 == 0x3a) && (pbVar15[1] == 0x3a)) && (pbVar15[2] == 0x3d))
          goto LAB_00106c7b;
          pbVar15 = (byte *)psStack_3f20->name;
          pcVar8 = "Expected to see a \":\" following the LHS symbol \"%s\".";
LAB_00107c19:
          ErrorMsg(pcStack_3f58,uStack_3f50,pcVar8,pbVar15);
LAB_00107c20:
          uStack_3f4c = uStack_3f4c + 1;
          uStack_3f38 = 0xe;
          psVar6 = psStack_3f30;
        }
        break;
      case 6:
        bVar26 = *pbVar15;
        uVar10 = (ulong)bVar26;
        if (uVar10 != 0x2e) {
          if ((*(byte *)((long)*ppuVar9 + uVar10 * 2 + 1) & 4) == 0) {
            if (uVar10 == 0x28) {
LAB_00107892:
              if (0 < (int)uStack_3f10) {
                uStack_3f38 = 10;
                break;
              }
            }
            else if ((bVar26 == 0x7c) || (bVar26 == 0x2f)) {
              lVar12 = (long)(int)uStack_3f10;
              if (0 < lVar12) {
                puVar24 = (undefined8 *)alStack_3f08[uStack_3f10 - 1];
                puVar18 = puVar24;
                if (*(int *)((long)puVar24 + 0xc) != 2) {
                  puVar18 = (undefined8 *)calloc(1,0x60);
                  *(undefined4 *)((long)puVar18 + 0xc) = 2;
                  *(undefined4 *)((long)puVar18 + 0x54) = 1;
                  plVar19 = (long *)calloc(1,8);
                  puVar18[0xb] = plVar19;
                  *plVar19 = (long)puVar24;
                  *puVar18 = *puVar24;
                  alStack_3f08[lVar12 + -1] = (long)puVar18;
                }
                iVar4 = *(int *)((long)puVar18 + 0x54);
                *(int *)((long)puVar18 + 0x54) = iVar4 + 1;
                pvVar20 = realloc((void *)puVar18[0xb],(long)iVar4 * 8 + 8);
                puVar18[0xb] = pvVar20;
                psVar7 = Symbol_new((char *)(pbVar15 + 1));
                *(symbol **)(puVar18[0xb] + -8 + (long)*(int *)((long)puVar18 + 0x54) * 8) = psVar7;
                if (((*(byte *)((long)*ppuVar9 + (ulong)pbVar15[1] * 2 + 1) & 2) != 0) ||
                   (psVar6 = psStack_3f30,
                   (*(byte *)((long)*ppuVar9 + (ulong)*(byte *)**(undefined8 **)puVar18[0xb] * 2 + 1
                             ) & 2) != 0)) {
                  Parse_cold_3();
                  psVar6 = psStack_3f30;
                }
                break;
              }
              if (bVar26 == 0x28) goto LAB_00107892;
            }
            pcVar8 = "Illegal character on RHS of rule: \"%s\".";
            goto LAB_00107c19;
          }
          if (999 < (int)uStack_3f10) {
            pcVar8 = "Too many symbols on RHS of rule beginning at \"%s\".";
            goto LAB_00107c19;
          }
          psVar7 = Symbol_new((char *)pbVar15);
          alStack_3f08[(int)uStack_3f10] = (long)psVar7;
          auStack_1fd0[(long)(int)uStack_3f10 + 1] = 0;
          uStack_3f10 = uStack_3f10 + 1;
          psVar6 = psStack_3f30;
          break;
        }
        uVar10 = (ulong)uStack_3f10;
        lVar12 = (long)(int)uStack_3f10;
        prVar16 = (rule *)calloc(lVar12 * 0x10 + 0x80,1);
        if (prVar16 == (rule *)0x0) {
          ErrorMsg(pcStack_3f58,uStack_3f50,"Can\'t allocate enough memory for this rule.");
          uStack_3f4c = uStack_3f4c + 1;
          prStack_88 = (rule *)0x0;
        }
        else {
          prVar16->ruleline = uStack_3f50;
          prVar16->rhs = &prVar16[1].lhs;
          prVar16->rhsalias = (char **)(&prVar16[1].lhs + lVar12);
          if (0 < (int)uVar32) {
            uVar35 = 0;
            do {
              prVar16->rhs[uVar35] = (symbol *)alStack_3f08[uVar35];
              prVar16->rhsalias[uVar35] = (char *)auStack_1fd0[uVar35 + 1];
              uVar35 = uVar35 + 1;
            } while (uVar10 != uVar35);
          }
          prVar16->lhs = psStack_3f20;
          prVar16->lhsalias = (char *)pbStack_3f18;
          prVar16->nrhs = uVar32;
          prVar16->code = (char *)0x0;
          prVar16->noCode = 1;
          prVar16->precsym = (symbol *)0x0;
          iVar4 = *(int *)(lStack_3f40 + 0x20);
          *(int *)(lStack_3f40 + 0x20) = iVar4 + 1;
          prVar16->index = iVar4;
          prVar16->nextlhs = psStack_3f20->rule;
          psStack_3f20->rule = prVar16;
          prVar16->next = (rule *)0x0;
          bVar39 = CONCAT44(uStack_54,uStack_58) != 0;
          puVar24 = (undefined8 *)(CONCAT44(uStack_4c,uStack_50) + 0x78);
          if (!bVar39) {
            puVar24 = (undefined8 *)&uStack_50;
          }
          *puVar24 = prVar16;
          *(rule **)(&uStack_58 + (ulong)bVar39 * 2) = prVar16;
          prStack_88 = prVar16;
        }
        goto LAB_001077f4;
      case 7:
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 4) == 0) {
          pbVar14 = (byte *)psStack_3f20->name;
          pcVar8 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
LAB_00107991:
          ErrorMsg(pcStack_3f58,uStack_3f50,pcVar8,pbVar15,pbVar14);
          goto LAB_00107c20;
        }
        uStack_3f38 = 8;
        pbStack_3f18 = pbVar15;
        break;
      case 8:
        if (*pbVar15 != 0x29) {
LAB_00107854:
          pcVar8 = "Missing \")\" following LHS alias name \"%s\".";
          pbVar15 = pbStack_3f18;
          goto LAB_00107c19;
        }
        uStack_3f38 = 9;
        break;
      case 9:
        if (((*pbVar15 != 0x3a) || (pbVar15[1] != 0x3a)) || (pbVar15[2] != 0x3d)) {
          pbVar15 = (byte *)psStack_3f20->name;
          pcVar8 = "Missing \"->\" following: \"%s(%s)\".";
          pbVar14 = pbStack_3f18;
          goto LAB_00107991;
        }
        goto LAB_00106c7b;
      case 10:
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 4) == 0) {
          pbVar14 = *(byte **)alStack_3f08[(long)(int)uStack_3f10 + -1];
          pcVar8 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
          goto LAB_00107991;
        }
        auStack_1fd0[(int)uStack_3f10] = pbVar15;
        uStack_3f38 = 0xb;
        break;
      case 0xb:
        if (*pbVar15 != 0x29) goto LAB_00107854;
LAB_00106c7b:
        uStack_3f38 = 6;
        break;
      case 0xc:
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 1) == 0) {
          Parse_cold_6();
        }
        else if (prStack_88 == (rule *)0x0) {
          ErrorMsg(pcStack_3f58,uStack_3f50,"There is no prior rule to assign precedence \"[%s]\".",
                   pbVar15);
          uStack_3f4c = uStack_3f4c + 1;
        }
        else if (prStack_88->precsym == (symbol *)0x0) {
          psVar7 = Symbol_new((char *)pbVar15);
          prStack_88->precsym = psVar7;
        }
        else {
          Parse_cold_5();
        }
        uStack_3f38 = 0xd;
        psVar6 = psStack_3f30;
        break;
      case 0xd:
        if (*pbVar15 != 0x5d) {
          Parse_cold_4();
        }
        goto LAB_001073d7;
      case 0xe:
      case 0xf:
        if (*pbVar15 == 0x2e) {
          uStack_3f38 = 1;
        }
        if (*pbVar15 != 0x25) break;
        goto LAB_00106fee;
      case 0x10:
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 4) == 0) {
          pcVar8 = "Symbol name missing after %%destructor keyword";
LAB_0010793e:
          ErrorMsg(pcStack_3f58,uStack_3f50,pcVar8);
          goto LAB_00107b2f;
        }
        psVar7 = Symbol_new((char *)pbVar15);
        ppcStack_78 = &psVar7->destructor;
        piStack_68 = &psVar7->destLineno;
        iStack_70 = 1;
        uStack_3f38 = 3;
        psVar6 = psStack_3f30;
        break;
      case 0x11:
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 4) == 0) {
          pcVar8 = "Symbol name missing after %%type keyword";
          goto LAB_0010793e;
        }
        psVar7 = Symbol_find((char *)pbVar15);
        if (psVar7 == (symbol *)0x0) {
          psVar7 = Symbol_new((char *)pbVar15);
        }
        else if (psVar7->datatype != (char *)0x0) {
          ErrorMsg(pcStack_3f58,uStack_3f50,"Symbol %%type \"%s\" already defined",pbVar15);
          uStack_3f4c = uStack_3f4c + 1;
          uStack_3f38 = 0xf;
          psVar6 = psStack_3f30;
          break;
        }
        ppcStack_78 = &psVar7->datatype;
        iStack_70 = 0;
        uStack_3f38 = 3;
        psVar6 = psStack_3f30;
        break;
      case 0x12:
        if ((ulong)*pbVar15 == 0x2e) goto LAB_001073d7;
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 1) == 0) {
          pcVar8 = "%%fallback argument \"%s\" should be a token";
          goto LAB_00107bb0;
        }
        psVar6 = Symbol_new((char *)pbVar15);
        if (psStack_3f30 != (symbol *)0x0) {
          if (psVar6->fallback != (symbol *)0x0) {
            pcVar8 = "More than one fallback assigned to token %s";
            goto LAB_00107bb0;
          }
          psVar6->fallback = psStack_3f30;
          *(undefined4 *)(lStack_3f40 + 0xf0) = 1;
          psVar6 = psStack_3f30;
        }
        break;
      case 0x13:
        if ((ulong)*pbVar15 != 0x2e) {
          if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 1) == 0) {
            pcVar8 = "%%wildcard argument \"%s\" should be a token";
          }
          else {
            psVar7 = Symbol_new((char *)pbVar15);
            if (*(long *)(lStack_3f40 + 0x40) == 0) {
              *(symbol **)(lStack_3f40 + 0x40) = psVar7;
              psVar6 = psStack_3f30;
              break;
            }
            pcVar8 = "Extra wildcard to token: %s";
          }
          goto LAB_00107bb0;
        }
LAB_001073d7:
        uStack_3f38 = 1;
        psVar6 = psStack_3f30;
        break;
      case 0x14:
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar15 * 2 + 1) & 2) == 0) {
          pcVar8 = "%%token_class must be followed by an identifier: ";
        }
        else {
          psVar7 = Symbol_find((char *)pbVar15);
          if (psVar7 == (symbol *)0x0) {
            psStack_3f28 = Symbol_new((char *)pbVar15);
            psStack_3f28->type = MULTITERMINAL;
            uStack_3f38 = 0x15;
            psVar6 = psStack_3f30;
            break;
          }
          pcVar8 = "Symbol \"%s\" already used";
        }
LAB_00107b28:
        ErrorMsg(pcStack_3f58,uStack_3f50,pcVar8,pbVar15);
LAB_00107b2f:
        uStack_3f4c = uStack_3f4c + 1;
        uStack_3f38 = 0xf;
        psVar6 = psStack_3f30;
        break;
      case 0x15:
        uVar10 = (ulong)*pbVar15;
        if (uVar10 == 0x2e) goto LAB_001073d7;
        if (((*(byte *)((long)*ppuVar9 + uVar10 * 2 + 1) & 1) == 0) &&
           (((uVar10 != 0x7c && (*pbVar15 != 0x2f)) ||
            ((*(byte *)((long)*ppuVar9 + (ulong)pbVar15[1] * 2 + 1) & 1) == 0)))) {
          pcVar8 = "%%token_class argument \"%s\" should be a token";
          goto LAB_00107b28;
        }
        iVar4 = psStack_3f28->nsubsym;
        psStack_3f28->nsubsym = iVar4 + 1;
        ppsVar17 = (symbol **)realloc(psStack_3f28->subsym,(long)iVar4 * 8 + 8);
        psVar7->subsym = ppsVar17;
        psVar6 = Symbol_new((char *)(pbVar15 + (((*ppuVar9)[*pbVar15] >> 8 & 1) == 0)));
        psVar7->subsym[(long)psVar7->nsubsym + -1] = psVar6;
        psVar6 = psStack_3f30;
      }
      goto switchD_00106b14_default;
    }
    pcVar8 = Strsafe(x);
    psVar7->name = pcVar8;
    ppuVar9 = __ctype_b_loc();
    psVar7->type = (uint)(((*ppuVar9)[(byte)*x] >> 8 & 1) == 0);
    psVar7->rule = (rule *)0x0;
    psVar7->fallback = (symbol *)0x0;
    psVar7->prec = -1;
    psVar7->assoc = UNK;
    psVar7->datatype = (char *)0x0;
    *(undefined8 *)&psVar7->useCnt = 0;
    *(undefined8 *)((long)&psVar7->destructor + 4) = 0;
    psVar7->firstset = (char *)0x0;
    psVar7->lambda = LEMON_FALSE;
    psVar7->useCnt = 0;
    Symbol_insert(psVar7,pcVar8);
  }
  psVar7->useCnt = psVar7->useCnt + 1;
  return psVar7;
LAB_001076da:
  sprintf(acStack_3f90,"#line %d ",(ulong)uStack_3f50);
  sVar11 = strlen(acStack_3f90);
  sVar34 = strlen(pcStack_3f58);
  iVar22 = iVar27 + iVar22 + (int)sVar11 + (int)sVar34;
  sVar11 = (size_t)(int)sVar11;
LAB_00107720:
  pcVar8 = (char *)realloc(*ppcStack_78,(long)iVar22);
  *ppcStack_78 = pcVar8;
  pcVar8 = *ppcStack_78 + iVar4;
  if (bVar39) {
    if ((iVar4 != 0) && (pcVar8[-1] != '\n')) {
      *pcVar8 = '\n';
      pcVar8 = pcVar8 + 1;
    }
    memcpy(pcVar8,acStack_3f90,sVar11);
    pcVar21 = pcVar8 + sVar11;
    pcVar8[sVar11] = '\"';
    pcVar8 = pcStack_3f58;
    do {
      if (*pcVar8 == '\\') {
        pcVar21[1] = '\\';
        pcVar21 = pcVar21 + 2;
      }
      else {
        if (*pcVar8 == '\0') goto LAB_001077af;
        pcVar21 = pcVar21 + 1;
      }
      *pcVar21 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while( true );
  }
LAB_001077bc:
  if ((piStack_68 != (int *)0x0) && (*piStack_68 == 0)) {
    *piStack_68 = uStack_3f50;
  }
  memcpy(pcVar8,pbVar15,(long)iVar5);
  pcVar8[iVar5] = '\0';
LAB_001077f4:
  uStack_3f38 = 1;
  psVar6 = psStack_3f30;
switchD_00106b14_default:
  psStack_3f30 = psVar6;
  *pbVar29 = bVar25;
  goto LAB_00106821;
LAB_001077af:
  pcVar21[1] = '\"';
  pcVar21[2] = '\n';
  pcVar8 = pcVar21 + 3;
  goto LAB_001077bc;
}

Assistant:

struct symbol *Symbol_new(const char *x)
{
  struct symbol *sp;

  sp = Symbol_find(x);
  if( sp==0 ){
    sp = (struct symbol *)calloc(1, sizeof(struct symbol) );
    MemoryCheck(sp);
    sp->name = Strsafe(x);
    sp->type = ISUPPER(*x) ? TERMINAL : NONTERMINAL;
    sp->rule = 0;
    sp->fallback = 0;
    sp->prec = -1;
    sp->assoc = UNK;
    sp->firstset = 0;
    sp->lambda = LEMON_FALSE;
    sp->destructor = 0;
	sp->destLineno = 0;
    sp->datatype = 0;
	sp->useCnt = 0;
    Symbol_insert(sp,sp->name);
  }
  sp->useCnt++;
  return sp;
}